

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_PackFontRanges
              (stbtt_pack_context *spc,uchar *fontdata,int font_index,stbtt_pack_range *ranges,
              int num_ranges)

{
  stbtt_packedchar *psVar1;
  undefined8 data2;
  int iVar2;
  stbrp_rect *rects;
  ulong uVar3;
  long lVar4;
  long lVar5;
  size_t __size;
  undefined1 local_78 [8];
  stbtt_fontinfo info;
  
  if (0 < num_ranges) {
    uVar3 = 0;
    do {
      iVar2 = ranges[uVar3].num_chars;
      if (0 < (long)iVar2) {
        psVar1 = ranges[uVar3].chardata_for_range;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)&psVar1->x0 + lVar5) = 0;
          lVar5 = lVar5 + 0x1c;
        } while ((long)iVar2 * 0x1c != lVar5);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)num_ranges);
  }
  iVar2 = 0;
  if (num_ranges < 1) {
    __size = 0;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar5 = (long)(int)lVar5 + (long)*(int *)((long)&ranges->num_chars + lVar4);
      lVar4 = lVar4 + 0x28;
    } while ((ulong)(uint)num_ranges * 0x28 != lVar4);
    __size = lVar5 * 0x18;
  }
  info._48_8_ = fontdata;
  rects = (stbrp_rect *)malloc(__size);
  data2 = info._48_8_;
  if (rects != (stbrp_rect *)0x0) {
    local_78 = (undefined1  [8])spc->user_allocator_context;
    iVar2 = stbtt_GetFontOffsetForIndex((uchar *)info._48_8_,font_index);
    stbtt_InitFont((stbtt_fontinfo *)local_78,(uchar *)data2,iVar2);
    iVar2 = stbtt_PackFontRangesGatherRects(spc,(stbtt_fontinfo *)local_78,ranges,num_ranges,rects);
    stbtt_PackFontRangesPackRects(spc,rects,iVar2);
    iVar2 = stbtt_PackFontRangesRenderIntoRects
                      (spc,(stbtt_fontinfo *)local_78,ranges,num_ranges,rects);
    free(rects);
  }
  return iVar2;
}

Assistant:

STBTT_DEF int stbtt_PackFontRanges(stbtt_pack_context *spc, unsigned char *fontdata, int font_index, stbtt_pack_range *ranges, int num_ranges)
{
   stbtt_fontinfo info;
   int i,j,n, return_value = 1;
   //stbrp_context *context = (stbrp_context *) spc->pack_info;
   stbrp_rect    *rects;

   // flag all characters as NOT packed
   for (i=0; i < num_ranges; ++i)
      for (j=0; j < ranges[i].num_chars; ++j)
         ranges[i].chardata_for_range[j].x0 =
         ranges[i].chardata_for_range[j].y0 =
         ranges[i].chardata_for_range[j].x1 =
         ranges[i].chardata_for_range[j].y1 = 0;

   n = 0;
   for (i=0; i < num_ranges; ++i)
      n += ranges[i].num_chars;
         
   rects = (stbrp_rect *) STBTT_malloc(sizeof(*rects) * n, spc->user_allocator_context);
   if (rects == NULL)
      return 0;

   info.userdata = spc->user_allocator_context;
   stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata,font_index));

   n = stbtt_PackFontRangesGatherRects(spc, &info, ranges, num_ranges, rects);

   stbtt_PackFontRangesPackRects(spc, rects, n);
  
   return_value = stbtt_PackFontRangesRenderIntoRects(spc, &info, ranges, num_ranges, rects);

   STBTT_free(rects, spc->user_allocator_context);
   return return_value;
}